

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

pair<bool,_std::pair<const_char_*,_unsigned_long>_> * __thiscall
Fixpp::impl::matchTag<Fixpp::TagT<8u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
          (pair<bool,_std::pair<const_char_*,_unsigned_long>_> *__return_storage_ptr__,impl *this,
          StreamCursor *cursor)

{
  bool bVar1;
  undefined1 auStack_58 [8];
  pair<const_char_*,_unsigned_long> ret;
  int local_1c [2];
  int tag;
  
  ret.second = (unsigned_long)this;
  bVar1 = match_int_fast(local_1c,(StreamCursor *)this);
  if ((bVar1) && (local_1c[0] == 8)) {
    bVar1 = match_literal_fast('=',(StreamCursor *)this);
    if (bVar1) {
      auStack_58 = (undefined1  [8])0x0;
      ret.first = (char *)0x0;
      bVar1 = TagMatcher<Fixpp::Type::String>::matchValue((Return *)auStack_58,(StreamCursor *)this)
      ;
      if (!bVar1) {
        (__return_storage_ptr__->second).first = (char *)0x0;
        (__return_storage_ptr__->second).second = 0;
      }
      else {
        (__return_storage_ptr__->second).first = (char *)auStack_58;
        (__return_storage_ptr__->second).second = (unsigned_long)ret.first;
      }
      __return_storage_ptr__->first = bVar1;
      goto LAB_0045ecb2;
    }
  }
  (__return_storage_ptr__->second).first = (char *)0x0;
  (__return_storage_ptr__->second).second = 0;
  __return_storage_ptr__->first = false;
LAB_0045ecb2:
  StreamCursor::Revert::~Revert((Revert *)&ret.second);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, Ret> matchTag(StreamCursor& cursor)
        {
            #define TRY_MATCH(...) \
            if (!__VA_ARGS__) \
               return std::make_pair(false, Ret {})

            StreamCursor::Revert revert(cursor);

            int tag;
            TRY_MATCH(match_int_fast(&tag, cursor));

            if (tag != Tag::Id)
               return std::make_pair(false, Ret {});

            TRY_MATCH(match_literal_fast('=', cursor));

            Ret ret;

            TRY_MATCH(TagMatcher<typename Tag::Type>::matchValue(&ret, cursor));

            revert.ignore();

            return std::make_pair(true, ret);

            #undef TRY_MATCH
        }